

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

Path * tinyusdz::Path::make_root_path(void)

{
  Path *in_RDI;
  string local_68;
  string local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"/","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  Path(in_RDI,&local_68,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::string::_M_replace
            ((ulong)&in_RDI->_element,0,(char *)(in_RDI->_element)._M_string_length,0x41f4cd);
  in_RDI->_valid = true;
  return in_RDI;
}

Assistant:

static Path make_root_path() {
    Path p = Path("/", "");
    // elementPath is empty for root.
    p._element = "";
    p._valid = true;
    return p;
  }